

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type_conflict
time_plain<boost::random::mersenne_twister_engine<unsigned_int,32ul,351ul,175ul,19ul,3433795303u,11ul,4294967295u,7ul,834054912u,15ul,4293197824u,17ul,1812433253u>>
          (mersenne_twister_engine<unsigned_int,_32UL,_351UL,_175UL,_19UL,_3433795303U,_11UL,_4294967295U,_7UL,_834054912U,_15UL,_4293197824U,_17UL,_1812433253U>
           *r)

{
  uint uVar1;
  long lVar2;
  result_type_conflict rVar3;
  long lVar4;
  string res;
  string local_48;
  double local_28;
  
  rVar3 = 0;
  lVar4 = 0x1000000;
  lVar2 = std::chrono::_V2::system_clock::now();
  do {
    if (r->i == 0x15f) {
      boost::random::
      mersenne_twister_engine<unsigned_int,_32UL,_351UL,_175UL,_19UL,_3433795303U,_11UL,_4294967295U,_7UL,_834054912U,_15UL,_4293197824U,_17UL,_1812433253U>
      ::twist(r);
    }
    uVar1 = r->x[r->i];
    r->i = r->i + 1;
    uVar1 = uVar1 >> 0xb ^ uVar1;
    uVar1 = (uVar1 & 0x636d56) << 7 ^ uVar1;
    uVar1 = (uVar1 & 0xffffffca) << 0xf ^ uVar1;
    rVar3 = rVar3 + (uVar1 >> 0x11 ^ uVar1);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = std::chrono::_V2::system_clock::now();
  local_28 = 16.777216 / ((double)((lVar4 - lVar2) / 1000) * 1e-06);
  to_string<double>(&local_48,&local_28);
  while (local_48._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return rVar3;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}